

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O1

void CTestGen12dGPUResource::SetUpTestCase(void)

{
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 *paVar1;
  ADAPTER_INFO *__s;
  
  puts("SetUpTestCase");
  CommonULT::GfxPlatform.eProductFamily = IGFX_XE_HP_SDV;
  CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;
  __s = (ADAPTER_INFO *)malloc(0x9bf);
  CommonULT::pGfxAdapterInfo = __s;
  if (__s != (ADAPTER_INFO *)0x0) {
    memset(__s,0,0x9bf);
    *(byte *)&(__s->SkuTable).field_0 = *(byte *)&(__s->SkuTable).field_0 | 0x40;
    paVar1 = &(__s->SkuTable).field_1;
    *paVar1 = (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)((ulong)*paVar1 | 0x100048000);
    CommonULT::SetUpTestCase();
    return;
  }
  return;
}

Assistant:

void CTestGen12dGPUResource::SetUpTestCase()
{
    printf("%s\n", __FUNCTION__);
    GfxPlatform.eProductFamily    = IGFX_XE_HP_SDV;
    GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;

    pGfxAdapterInfo = (ADAPTER_INFO *)malloc(sizeof(ADAPTER_INFO));
    if(pGfxAdapterInfo)
    {
        memset(pGfxAdapterInfo, 0, sizeof(ADAPTER_INFO));

        pGfxAdapterInfo->SkuTable.FtrLinearCCS             = 1; //legacy y =>0 - test both
        pGfxAdapterInfo->SkuTable.FtrStandardMipTailFormat = 1;
        pGfxAdapterInfo->SkuTable.FtrTileY                 = 1;
        pGfxAdapterInfo->SkuTable.FtrTile64Optimization    = 1;
	CommonULT::SetUpTestCase();
    }
}